

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLoader.c
# Opt level: O0

UINT8 FileLoader_dopen(void *context)

{
  uint uVar1;
  UINT32 UVar2;
  FILE *pFVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  UINT8 local_34 [4];
  size_t sStack_30;
  UINT8 sizeBuffer [4];
  size_t readBytes;
  undefined1 *puStack_20;
  UINT8 fileHdr [4];
  FILE_LOADER *loader;
  void *context_local;
  
  puStack_20 = (undefined1 *)context;
  pFVar3 = fopen(*(char **)((long)context + 0x10),"rb");
  *(FILE **)(puStack_20 + 8) = pFVar3;
  if (*(long *)(puStack_20 + 8) == 0) {
    context_local._7_1_ = '\x01';
  }
  else {
    sStack_30 = fread((void *)((long)&readBytes + 4),1,4,*(FILE **)(puStack_20 + 8));
    if (sStack_30 < 4) {
      memset((void *)((long)&readBytes + sStack_30 + 4),0,4 - sStack_30);
    }
    if ((readBytes._4_1_ == '\x1f') && (readBytes._5_1_ == -0x75)) {
      fseek(*(FILE **)(puStack_20 + 8),-4,2);
      fread(local_34,4,1,*(FILE **)(puStack_20 + 8));
      UVar2 = ReadLE32(local_34);
      *(UINT32 *)(puStack_20 + 4) = UVar2;
      uVar1 = *(uint *)(puStack_20 + 4);
      uVar4 = ftell(*(FILE **)(puStack_20 + 8));
      if (uVar1 < ((uint)(uVar4 >> 1) & 0x7fffffff)) {
        *(undefined4 *)(puStack_20 + 4) = 0;
      }
      fclose(*(FILE **)(puStack_20 + 8));
      *(undefined8 *)(puStack_20 + 8) = 0;
      uVar5 = gzopen(*(undefined8 *)(puStack_20 + 0x10),"rb");
      *(undefined8 *)(puStack_20 + 8) = uVar5;
      if (*(long *)(puStack_20 + 8) == 0) {
        context_local._7_1_ = '\x01';
      }
      else {
        *puStack_20 = 0x10;
        *(code **)(puStack_20 + 0x18) = FileLoader_ReadGZ;
        *(code **)(puStack_20 + 0x20) = FileLoader_SeekGZ;
        *(code **)(puStack_20 + 0x28) = FileLoader_CloseGZ;
        *(code **)(puStack_20 + 0x30) = FileLoader_TellGZ;
        *(code **)(puStack_20 + 0x38) = FileLoader_EofGZ;
        context_local._7_1_ = '\0';
      }
    }
    else {
      fseek(*(FILE **)(puStack_20 + 8),0,2);
      lVar6 = ftell(*(FILE **)(puStack_20 + 8));
      *(int *)(puStack_20 + 4) = (int)lVar6;
      rewind(*(FILE **)(puStack_20 + 8));
      *puStack_20 = 0;
      *(code **)(puStack_20 + 0x18) = FileLoader_ReadRaw;
      *(code **)(puStack_20 + 0x20) = FileLoader_SeekRaw;
      *(code **)(puStack_20 + 0x28) = FileLoader_CloseRaw;
      *(code **)(puStack_20 + 0x30) = FileLoader_TellRaw;
      *(code **)(puStack_20 + 0x38) = FileLoader_EofRaw;
      context_local._7_1_ = '\0';
    }
  }
  return context_local._7_1_;
}

Assistant:

static UINT8 FileLoader_dopen(void *context)
{
	FILE_LOADER *loader = (FILE_LOADER *)context;
	UINT8 fileHdr[4];
	size_t readBytes;

#if HAVE_FILELOADER_W
	if (loader->fileName == NULL)
		loader->hLoad.hFileRaw = _wfopen(loader->fileNameW, L"rb");
	else
#endif
		loader->hLoad.hFileRaw = fopen(loader->fileName, "rb");
	if (loader->hLoad.hFileRaw == NULL) return 0x01;

	readBytes = fread(fileHdr, 0x01, 4, loader->hLoad.hFileRaw);
	if (readBytes < 4)
		memset(&fileHdr[readBytes], 0x00, 4 - readBytes);

	if (fileHdr[0] == 31 && fileHdr[1] == 139)	// check for .gz file header
	{
		UINT8 sizeBuffer[4];
		fseek(loader->hLoad.hFileRaw, -4, SEEK_END);
		fread(sizeBuffer, 0x04, 0x01, loader->hLoad.hFileRaw);
		loader->bytesTotal = ReadLE32(sizeBuffer);
		if (loader->bytesTotal < (UINT32)ftell(loader->hLoad.hFileRaw) / 2)
			loader->bytesTotal = 0;
		fclose(loader->hLoad.hFileRaw);
		loader->hLoad.hFileRaw = NULL;

#if HAVE_FILELOADER_W
		if (loader->fileName == NULL)
			loader->hLoad.hFileGZ = gzopen_w(loader->fileNameW, "rb");
		else
#endif
			loader->hLoad.hFileGZ = gzopen(loader->fileName, "rb");
		if (loader->hLoad.hFileGZ == NULL)
			return 0x01;	// TODO: separate error code for "invalid .gz file"
		loader->modeCompr = FLMODE_CMP_GZ;
		loader->Read = &FileLoader_ReadGZ;
		loader->Seek = &FileLoader_SeekGZ;
		loader->Close = &FileLoader_CloseGZ;
		loader->Tell = &FileLoader_TellGZ;
		loader->Eof = &FileLoader_EofGZ;
		return 0x00;
	}

	fseek(loader->hLoad.hFileRaw, 0, SEEK_END);
	loader->bytesTotal = ftell(loader->hLoad.hFileRaw);
	rewind(loader->hLoad.hFileRaw);

	loader->modeCompr = FLMODE_CMP_RAW;
	loader->Read = &FileLoader_ReadRaw;
	loader->Seek = &FileLoader_SeekRaw;
	loader->Close = &FileLoader_CloseRaw;
	loader->Tell = &FileLoader_TellRaw;
	loader->Eof = &FileLoader_EofRaw;

	return 0x00;
}